

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::BlendTestCaseGroup::BlendTest::iterate(BlendTest *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  code *pcVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  RenderContext *pRVar14;
  undefined4 extraout_var;
  PixelFormat *this_01;
  long lVar15;
  TestLog *this_02;
  char *pcVar16;
  TestError *this_03;
  float *pfVar17;
  void *pvVar18;
  int *piVar19;
  MessageBuilder *pMVar20;
  GLSLVersion glslVersion;
  char *in_R8;
  bool local_6e2;
  glcts *local_570;
  RGBA local_55c;
  RGBA local_558;
  deUint32 local_554;
  deUint32 local_550;
  RGBA local_54c;
  MessageBuilder local_548;
  deUint32 local_3c4;
  deUint32 local_3c0;
  deUint32 local_3bc;
  undefined1 local_3b5;
  int local_3b4;
  int iStack_3b0;
  bool pixelOk;
  int local_3ac;
  int local_3a8 [3];
  int local_39c;
  int local_398;
  RGBA local_394;
  RGBA local_390;
  RGBA threshold;
  RGBA tmp;
  RGBA res;
  undefined1 local_380 [4];
  RGBA ref;
  Vec4 refCol;
  int y_1;
  int x_1;
  Vec4 dstCol_1;
  Vec4 srcCol_1;
  int colorIndex_1;
  bool pass;
  GLubyte *resultBytes;
  int h;
  int w;
  int local_318;
  int local_314;
  int y;
  int x;
  Vec4 dstCol;
  Vec4 srcCol;
  int colorIndex;
  bool needBarrier;
  undefined1 local_2c8 [8];
  VertexArrayBinding posBinding;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  ProgramSources local_208;
  undefined1 local_128 [8];
  ShaderProgram p;
  string frgSrc;
  TestLog *log;
  Functions *gl;
  PixelFormat *pf;
  RenderTarget *rt;
  BlendTest *this_local;
  RenderTarget *this_00;
  undefined4 extraout_var_00;
  
  pRVar14 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar14->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar7);
  this_01 = tcu::RenderTarget::getPixelFormat(this_00);
  pRVar14 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar14->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var_00,iVar7);
  this_02 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  bVar6 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar6) {
    if ((this->m_useAllQualifier & 1U) == 0) {
      local_570 = (glcts *)GetLayoutQualifierStr(this->m_mode);
    }
    else {
      local_570 = (glcts *)0x2b289d5;
    }
    pcVar16 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              ((string *)&p.m_program.m_info.linkTimeUs,local_570,pcVar16,
               "#extension GL_KHR_blend_equation_advanced : require",in_R8);
    pRVar14 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    GetDef2DVtxSrc_abi_cxx11_(&local_248,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar16,&local_249);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,pcVar16,(allocator<char> *)((long)&posBinding.pointer.data + 7))
    ;
    glu::makeVtxFragSources(&local_208,&local_228,&local_270);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_128,pRVar14,&local_208);
    glu::ProgramSources::~ProgramSources(&local_208);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)((long)&posBinding.pointer.data + 7));
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_249);
    std::__cxx11::string::~string((string *)&local_248);
    bVar6 = glu::ShaderProgram::isOk((ShaderProgram *)local_128);
    if (!bVar6) {
      glu::operator<<(this_02,(ShaderProgram *)local_128);
      this_03 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_03,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar4 = *(code **)(lVar15 + 0x1680);
    dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_128);
    (*pcVar4)(dVar8);
    dVar8 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar8,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorIndex,"aPos",(allocator<char> *)((long)srcCol.m_data + 0xf));
    glu::va::Float((VertexArrayBinding *)local_2c8,(string *)&colorIndex,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)&colorIndex);
    std::allocator<char>::~allocator((allocator<char> *)((long)srcCol.m_data + 0xf));
    (**(code **)(lVar15 + 0x4e8))(0xbd0);
    (**(code **)(lVar15 + 0x5e0))(0xc11);
    (**(code **)(lVar15 + 0x5e0))(0xbe2);
    (**(code **)(lVar15 + 0x100))(this->m_mode);
    dVar8 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar8,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3ba);
    bVar6 = IsExtensionSupported
                      ((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced_coherent");
    srcCol.m_data[3]._2_1_ = (bVar6 ^ 0xffU) & 1;
    for (srcCol.m_data[2] = 0.0; (int)srcCol.m_data[2] < this->m_numColors;
        srcCol.m_data[2] = (float)((int)srcCol.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dstCol.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&y);
      getTestColors(this,(int)srcCol.m_data[2],(Vec4 *)(dstCol.m_data + 2),(Vec4 *)&y);
      getCoordinates(this,(int)srcCol.m_data[2],&local_314,&local_318);
      (**(code **)(lVar15 + 0x1290))(local_314,local_318,1);
      pcVar4 = *(code **)(lVar15 + 0x1c0);
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&y,0);
      fVar1 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&y,1);
      fVar2 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&y,2);
      fVar3 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&y,3);
      (*pcVar4)(fVar1,fVar2,fVar3,*pfVar17);
      (**(code **)(lVar15 + 0x188))(0x4000);
      if ((srcCol.m_data[3]._2_1_ & 1) != 0) {
        (**(code **)(lVar15 + 0xf0))();
      }
      pcVar4 = *(code **)(lVar15 + 0x15a0);
      pcVar5 = *(code **)(lVar15 + 0xb48);
      dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_128);
      uVar9 = (*pcVar5)(dVar8);
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(dstCol.m_data + 2),0);
      fVar1 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(dstCol.m_data + 2),1);
      fVar2 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(dstCol.m_data + 2),2);
      fVar3 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(dstCol.m_data + 2),3);
      (*pcVar4)(fVar1,fVar2,fVar3,*pfVar17,uVar9);
      dVar8 = (**(code **)(lVar15 + 0x800))();
      glu::checkError(dVar8,"Uniforms failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x3d1);
      pRVar14 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
      dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_128);
      glu::pr::Triangles((PrimitiveList *)&h,6,(deUint16 *)s_indices);
      glu::draw(pRVar14,dVar8,1,(VertexArrayBinding *)local_2c8,(PrimitiveList *)&h,
                (DrawUtilCallback *)0x0);
      dVar8 = (**(code **)(lVar15 + 0x800))();
      glu::checkError(dVar8,"Draw failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x3d6);
      if ((srcCol.m_data[3]._2_1_ & 1) != 0) {
        (**(code **)(lVar15 + 0xf0))();
      }
    }
    iVar7 = tcu::RenderTarget::getWidth(this_00);
    iVar10 = tcu::RenderTarget::getHeight(this_00);
    pvVar18 = operator_new__((long)(iVar7 * iVar10 * 4));
    (**(code **)(lVar15 + 0xff0))(0xd05,1);
    (**(code **)(lVar15 + 0x1220))(0,0,iVar7,iVar10,0x1908,0x1401,pvVar18);
    dVar8 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar8,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3e1);
    srcCol_1.m_data[3]._3_1_ = 1;
    for (srcCol_1.m_data[2] = 0.0; (int)srcCol_1.m_data[2] < this->m_numColors;
        srcCol_1.m_data[2] = (float)((int)srcCol_1.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dstCol_1.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&y_1);
      getTestColors(this,(int)srcCol_1.m_data[2],(Vec4 *)(dstCol_1.m_data + 2),(Vec4 *)&y_1);
      getCoordinates(this,(int)srcCol_1.m_data[2],(int *)(refCol.m_data + 3),
                     (int *)(refCol.m_data + 2));
      Blend((glcts *)local_380,this->m_mode,(Vec4 *)(dstCol_1.m_data + 2),(Vec4 *)&y_1);
      tcu::RGBA::RGBA(&tmp,(Vec4 *)local_380);
      res = tcu::PixelFormat::convertColor(this_01,&tmp);
      threshold = tcu::RGBA::fromBytes
                            ((deUint8 *)
                             ((long)pvVar18 +
                             (long)(((int)refCol.m_data[3] + iVar7 * (int)refCol.m_data[2]) * 4)));
      local_390 = tcu::PixelFormat::getColorThreshold(this_01);
      iVar10 = tcu::RGBA::getRed(&local_390);
      local_398 = iVar10 * 2 + 2;
      local_39c = 0xff;
      piVar19 = std::min<int>(&local_398,&local_39c);
      iVar10 = *piVar19;
      iVar11 = tcu::RGBA::getGreen(&local_390);
      local_3a8[2] = iVar11 * 2 + 2;
      local_3a8[1] = 0xff;
      piVar19 = std::min<int>(local_3a8 + 2,local_3a8 + 1);
      iVar11 = *piVar19;
      iVar12 = tcu::RGBA::getBlue(&local_390);
      local_3a8[0] = iVar12 * 2 + 2;
      local_3ac = 0xff;
      piVar19 = std::min<int>(local_3a8,&local_3ac);
      iVar12 = *piVar19;
      iVar13 = tcu::RGBA::getAlpha(&local_390);
      iStack_3b0 = iVar13 * 2 + 2;
      local_3b4 = 0xff;
      piVar19 = std::min<int>(&stack0xfffffffffffffc50,&local_3b4);
      tcu::RGBA::RGBA(&local_394,iVar10,iVar11,iVar12,*piVar19);
      local_3bc = res.m_value;
      local_3c0 = threshold.m_value;
      local_3c4 = local_394.m_value;
      local_3b5 = tcu::compareThreshold(res,threshold,local_394);
      local_6e2 = false;
      if ((srcCol_1.m_data[3]._3_1_ & 1) != 0) {
        local_6e2 = (bool)local_3b5;
      }
      srcCol_1.m_data[3]._3_1_ = local_6e2;
      if (!(bool)local_3b5) {
        tcu::TestLog::operator<<(&local_548,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar20 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [2])0x2afcbef);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(int *)(refCol.m_data + 3));
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [2])0x2c5c975);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(int *)(refCol.m_data + 2));
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [4])")  ");
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [2])0x2afcbef);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(int *)(srcCol_1.m_data + 2));
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [3])0x2b47c71);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [10])"Exceeds: ");
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&local_394);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [7])" diff:");
        local_550 = res.m_value;
        local_554 = threshold.m_value;
        local_54c = tcu::computeAbsDiff(res,threshold);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&local_54c);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [7])"  res:");
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&threshold);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [7])"  ref:");
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&res);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [7])"  dst:");
        tcu::RGBA::RGBA(&local_558,(Vec4 *)&y_1);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&local_558);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [7])"  src:");
        tcu::RGBA::RGBA(&local_55c,(Vec4 *)(dstCol_1.m_data + 2));
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&local_55c);
        tcu::MessageBuilder::operator<<(pMVar20,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_548);
      }
    }
    pcVar16 = "Fail (results differ)";
    if ((srcCol_1.m_data[3]._3_1_ & 1) != 0) {
      pcVar16 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~srcCol_1.m_data[3]._3_1_ & QP_TEST_RESULT_FAIL,pcVar16);
    if (pvVar18 != (void *)0x0) {
      operator_delete__(pvVar18);
    }
    glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_2c8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_128);
    std::__cxx11::string::~string((string *)&p.m_program.m_info.linkTimeUs);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

BlendTestCaseGroup::BlendTest::IterateResult BlendTestCaseGroup::BlendTest::iterate(void)
{
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	// Setup program.
	std::string frgSrc =
		GetSolidShader(m_useAllQualifier ? "blend_support_all_equations" : GetLayoutQualifierStr(m_mode),
					   glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_SCISSOR_TEST);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	// Render loop.
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get pixel to blend.
		int x, y;
		getCoordinates(colorIndex, x, y);
		gl.scissor(x, y, 1, 1);

		// Clear to destination color.
		gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
		gl.clear(GL_COLOR_BUFFER_BIT);
		if (needBarrier)
			gl.blendBarrier();

		// Set source color.
		gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

		// Draw.
		glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		if (needBarrier)
			gl.blendBarrier();
	}

	// Read the results.
	const int	 w			  = rt.getWidth();
	const int	 h			  = rt.getHeight();
	glw::GLubyte* resultBytes = new glw::GLubyte[4 * w * h];
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.readPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, resultBytes);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	bool pass = true;
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get result and calculate reference.
		int x, y;
		getCoordinates(colorIndex, x, y);

		tcu::Vec4 refCol	= Blend(m_mode, srcCol, dstCol);
		tcu::RGBA ref		= pf.convertColor(tcu::RGBA(refCol));
		tcu::RGBA res		= tcu::RGBA::fromBytes(resultBytes + 4 * (x + w * y));
		tcu::RGBA tmp		= pf.getColorThreshold();
		tcu::RGBA threshold = tcu::RGBA(std::min(2 + 2 * tmp.getRed(), 255), std::min(2 + 2 * tmp.getGreen(), 255),
										std::min(2 + 2 * tmp.getBlue(), 255), std::min(2 + 2 * tmp.getAlpha(), 255));
		bool pixelOk = tcu::compareThreshold(ref, res, threshold);
		pass		 = pass && pixelOk;
		if (!pixelOk)
		{
			log << TestLog::Message << "(" << x << "," << y << ")  "
				<< "(" << colorIndex << ") "
				<< "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res) << "  res:" << res
				<< "  ref:" << ref << "  dst:" << tcu::RGBA(dstCol) << "  src:" << tcu::RGBA(srcCol)
				<< TestLog::EndMessage;
		}
	}

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	delete[] resultBytes;
	return STOP;
}